

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

void refresh(game_event_type type,game_event_data *data,void *user)

{
  _Bool _Var1;
  loc_conflict target;
  loc_conflict local_10;
  
  if ((player->opts).opt[8] == true) {
    _Var1 = target_sighted();
    if (_Var1) {
      target_get(&local_10);
      move_cursor_relative(local_10.y,local_10.x);
    }
  }
  Term_fresh();
  return;
}

Assistant:

static void refresh(game_event_type type, game_event_data *data, void *user)
{
	/* Place cursor on player/target */
	if (OPT(player, show_target) && target_sighted()) {
		struct loc target;
		target_get(&target);
		move_cursor_relative(target.y, target.x);
	}

	Term_fresh();
}